

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lumeview.cpp
# Opt level: O1

void __thiscall lumeview::Lumeview::render(Lumeview *this)

{
  ArcBallView *this_00;
  Scene *pSVar1;
  View *pVVar2;
  vec2 clipDists;
  anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2 local_20;
  
  (*glad_glEnable)(0xb71);
  (*glad_glClearColor)(0.25,0.25,0.25,1.0);
  (*glad_glClear)(0x4100);
  pSVar1 = (this->m_scene).super___shared_ptr<lumeview::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (pSVar1 != (Scene *)0x0) {
    this_00 = &this->m_arcBallView;
    pVVar2 = ArcBallView::view(this_00);
    local_20.field_0 =
         (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0
          )Scene::estimate_z_clip_dists(pSVar1,pVVar2);
    pVVar2 = ArcBallView::view(this_00);
    View::set_z_clip_dists(pVVar2,(vec2 *)&local_20.field_0);
    pSVar1 = (this->m_scene).super___shared_ptr<lumeview::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pVVar2 = ArcBallView::view(this_00);
    Scene::render(pSVar1,pVVar2);
  }
  ImGui_Display((ImDrawData *)0x0);
  return;
}

Assistant:

void Lumeview::render ()
{
	glEnable (GL_DEPTH_TEST);

	glClearColor (0.25f, 0.25f, 0.25f, 1.0f);
	glClear (GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	if (m_scene) {
		const glm::vec2 clipDists = m_scene->estimate_z_clip_dists(m_arcBallView.view());
		m_arcBallView.view().set_z_clip_dists (clipDists);
		m_scene->render (m_arcBallView.view());
	}

	lumeview::ImGui_Display();
}